

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sswConstr.c
# Opt level: O1

int Ssw_ManSetConstrPhases_(Aig_Man_t *p,int nFrames,Vec_Int_t **pvInits)

{
  lit *begin;
  uint uVar1;
  int Entry;
  Cnf_Dat_t *p_00;
  sat_solver *s;
  Vec_Int_t *p_01;
  int *piVar2;
  ulong uVar3;
  Vec_Int_t *pVVar4;
  int iVar5;
  int iVar6;
  long lVar7;
  
  if (pvInits != (Vec_Int_t **)0x0) {
    *pvInits = (Vec_Int_t *)0x0;
  }
  if (p->nConstrs < 1) {
    __assert_fail("p->nConstrs > 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/proof/ssw/sswConstr.c"
                  ,0xa5,"int Ssw_ManSetConstrPhases_(Aig_Man_t *, int, Vec_Int_t **)");
  }
  iVar5 = p->nRegs;
  iVar6 = p->nObjs[3];
  p->nRegs = 0;
  p_00 = Cnf_Derive(p,iVar6);
  p->nRegs = iVar5;
  s = (sat_solver *)Cnf_DataWriteIntoSolver(p_00,nFrames,0);
  if (s->size != p_00->nVars * nFrames) {
    __assert_fail("pSat->size == nFrames * pCnf->nVars",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/proof/ssw/sswConstr.c"
                  ,0xac,"int Ssw_ManSetConstrPhases_(Aig_Man_t *, int, Vec_Int_t **)");
  }
  p_01 = (Vec_Int_t *)malloc(0x10);
  p_01->nCap = 100;
  p_01->nSize = 0;
  piVar2 = (int *)malloc(400);
  p_01->pArray = piVar2;
  if (0 < p->nRegs) {
    iVar5 = 0;
    do {
      uVar1 = p->nTruePis + iVar5;
      if (((int)uVar1 < 0) || (p->vCis->nSize <= (int)uVar1)) {
LAB_0060db5f:
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/vec/vecPtr.h"
                      ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
      }
      if (p_00->pVarNums[*(int *)((long)p->vCis->pArray[uVar1] + 0x24)] < 0) {
        __assert_fail("pCnf->pVarNums[Aig_ObjId(pObj)] >= 0",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/proof/ssw/sswConstr.c"
                      ,0xb1,"int Ssw_ManSetConstrPhases_(Aig_Man_t *, int, Vec_Int_t **)");
      }
      Vec_IntPush(p_01,p_00->pVarNums[*(int *)((long)p->vCis->pArray[uVar1] + 0x24)] * 2 + 1);
      iVar5 = iVar5 + 1;
    } while (iVar5 < p->nRegs);
  }
  if (0 < nFrames) {
    iVar5 = 0;
    do {
      uVar3 = (ulong)(uint)p->nTruePos;
      if (0 < p->nTruePos) {
        lVar7 = 0;
        do {
          if (p->vCos->nSize <= lVar7) goto LAB_0060db5f;
          if ((long)(int)uVar3 - (long)p->nConstrs <= lVar7) {
            if (p_00->pVarNums[*(int *)((long)p->vCos->pArray[lVar7] + 0x24)] < 0) {
              __assert_fail("pCnf->pVarNums[Aig_ObjId(pObj)] >= 0",
                            "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/proof/ssw/sswConstr.c"
                            ,0xba,"int Ssw_ManSetConstrPhases_(Aig_Man_t *, int, Vec_Int_t **)");
            }
            Vec_IntPush(p_01,(p_00->nVars * iVar5 +
                             p_00->pVarNums[*(int *)((long)p->vCos->pArray[lVar7] + 0x24)]) * 2 + 1)
            ;
          }
          lVar7 = lVar7 + 1;
          uVar3 = (ulong)p->nTruePos;
        } while (lVar7 < (long)uVar3);
      }
      iVar5 = iVar5 + 1;
    } while (iVar5 != nFrames);
  }
  begin = p_01->pArray;
  iVar5 = sat_solver_solve(s,begin,begin + p_01->nSize,1000000,0,0,0);
  if ((pvInits != (Vec_Int_t **)0x0) && (iVar5 == 1)) {
    pVVar4 = (Vec_Int_t *)malloc(0x10);
    pVVar4->nCap = 1000;
    pVVar4->nSize = 0;
    piVar2 = (int *)malloc(4000);
    pVVar4->pArray = piVar2;
    *pvInits = pVVar4;
    if (0 < nFrames) {
      iVar6 = 0;
      do {
        if (0 < p->nTruePis) {
          lVar7 = 0;
          do {
            if (p->vCis->nSize <= lVar7) goto LAB_0060db5f;
            pVVar4 = *pvInits;
            Entry = sat_solver_var_value
                              (s,p_00->nVars * iVar6 +
                                 p_00->pVarNums[*(int *)((long)p->vCis->pArray[lVar7] + 0x24)]);
            Vec_IntPush(pVVar4,Entry);
            lVar7 = lVar7 + 1;
          } while (lVar7 < p->nTruePis);
        }
        iVar6 = iVar6 + 1;
      } while (iVar6 != nFrames);
    }
  }
  sat_solver_delete(s);
  if (begin != (lit *)0x0) {
    free(begin);
    p_01->pArray = (int *)0x0;
  }
  free(p_01);
  Cnf_DataFree(p_00);
  iVar6 = 1;
  if (iVar5 != -1) {
    iVar6 = -(uint)(iVar5 != 1);
  }
  return iVar6;
}

Assistant:

int Ssw_ManSetConstrPhases_( Aig_Man_t * p, int nFrames, Vec_Int_t ** pvInits )
{
    Vec_Int_t * vLits;
    sat_solver * pSat;
    Cnf_Dat_t * pCnf;
    Aig_Obj_t * pObj;
    int i, f, iVar, RetValue, nRegs;
    if ( pvInits )
        *pvInits = NULL;
    assert( p->nConstrs > 0 );
    // create CNF
    nRegs = p->nRegs; p->nRegs = 0;
    pCnf = Cnf_Derive( p, Aig_ManCoNum(p) );
    p->nRegs = nRegs;
    // create SAT solver
    pSat = (sat_solver *)Cnf_DataWriteIntoSolver( pCnf, nFrames, 0 );
    assert( pSat->size == nFrames * pCnf->nVars );
    // collect constraint literals
    vLits = Vec_IntAlloc( 100 );
    Saig_ManForEachLo( p, pObj, i )
    {
        assert( pCnf->pVarNums[Aig_ObjId(pObj)] >= 0 );
        Vec_IntPush( vLits, toLitCond(pCnf->pVarNums[Aig_ObjId(pObj)], 1) );
    }
    for ( f = 0; f < nFrames; f++ )
    {
        Saig_ManForEachPo( p, pObj, i )
        {
            if ( i < Saig_ManPoNum(p) - Saig_ManConstrNum(p) )
                continue;
            assert( pCnf->pVarNums[Aig_ObjId(pObj)] >= 0 );
            iVar = pCnf->pVarNums[Aig_ObjId(pObj)] + pCnf->nVars*f;
            Vec_IntPush( vLits, toLitCond(iVar, 1) );
        }
    }
    RetValue = sat_solver_solve( pSat, (int *)Vec_IntArray(vLits),
        (int *)Vec_IntArray(vLits) + Vec_IntSize(vLits),
        (ABC_INT64_T)1000000, (ABC_INT64_T)0, (ABC_INT64_T)0, (ABC_INT64_T)0 );
    if ( RetValue == l_True && pvInits )
    {
        *pvInits = Vec_IntAlloc( 1000 );
        for ( f = 0; f < nFrames; f++ )
        {
            Saig_ManForEachPi( p, pObj, i )
            {
                iVar = pCnf->pVarNums[Aig_ObjId(pObj)] + pCnf->nVars*f;
                Vec_IntPush( *pvInits, sat_solver_var_value(pSat, iVar) );
            }
        }
    }
    sat_solver_delete( pSat );
    Vec_IntFree( vLits );
    Cnf_DataFree( pCnf );
    if ( RetValue == l_False )
        return 1;
    if ( RetValue == l_True )
        return 0;
    return -1;
}